

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.h
# Opt level: O0

float ai_strtof(char *begin,char *end)

{
  char *__nptr;
  double dVar1;
  allocator local_51;
  string local_50 [8];
  string token;
  size_type len;
  float val;
  char *end_local;
  char *begin_local;
  
  if (begin == (char *)0x0) {
    begin_local._4_4_ = 0.0;
  }
  else {
    if (end == (char *)0x0) {
      dVar1 = atof(begin);
    }
    else {
      token.field_2._8_8_ = (long)end - (long)begin;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,begin,(long)end - (long)begin,&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      __nptr = (char *)std::__cxx11::string::c_str();
      dVar1 = atof(__nptr);
      std::__cxx11::string::~string(local_50);
    }
    len._4_4_ = (float)dVar1;
    begin_local._4_4_ = len._4_4_;
  }
  return begin_local._4_4_;
}

Assistant:

AI_FORCE_INLINE
float ai_strtof( const char *begin, const char *end ) {
    if ( nullptr == begin ) {
        return 0.0f;
    }
    float val( 0.0f );
    if ( nullptr == end ) {
        val = static_cast< float >( ::atof( begin ) );
    } else {
        std::string::size_type len( end - begin );
        std::string token( begin, len );
        val = static_cast< float >( ::atof( token.c_str() ) );
    }

    return val;
}